

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseEventModuleField(WastParser *this,Module *module)

{
  Result RVar1;
  Enum EVar2;
  EventModuleField *local_50;
  _Head_base<0UL,_wabt::EventModuleField_*,_false> local_48;
  Location local_40;
  
  RVar1 = Expect(this,Lpar);
  if (RVar1.enum_ == Error) {
    EVar2 = Error;
  }
  else {
    GetLocation(&local_40,this);
    MakeUnique<wabt::EventModuleField,wabt::Location>((wabt *)&local_50,&local_40);
    RVar1 = Expect(this,Event);
    EVar2 = Error;
    if (RVar1.enum_ != Error) {
      ParseBindVarOpt(this,&(local_50->event).name);
      RVar1 = ParseTypeUseOpt(this,&(local_50->event).decl);
      if (RVar1.enum_ != Error) {
        RVar1 = ParseUnboundFuncSignature(this,&(local_50->event).decl.sig);
        if (RVar1.enum_ != Error) {
          RVar1 = Expect(this,Rpar);
          if (RVar1.enum_ != Error) {
            local_48._M_head_impl = local_50;
            local_50 = (EventModuleField *)0x0;
            Module::AppendField(module,(unique_ptr<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_>
                                        *)&local_48);
            if (local_48._M_head_impl != (EventModuleField *)0x0) {
              (*((local_48._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).
                super_ModuleField._vptr_ModuleField[1])();
            }
            local_48._M_head_impl = (EventModuleField *)0x0;
            EVar2 = Ok;
          }
        }
      }
    }
    if (local_50 != (EventModuleField *)0x0) {
      (*(local_50->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.
        _vptr_ModuleField[1])();
    }
  }
  return (Result)EVar2;
}

Assistant:

Result WastParser::ParseEventModuleField(Module* module) {
  WABT_TRACE(ParseEventModuleField);
  EXPECT(Lpar);
  auto field = MakeUnique<EventModuleField>(GetLocation());
  EXPECT(Event);
  ParseBindVarOpt(&field->event.name);
  CHECK_RESULT(ParseTypeUseOpt(&field->event.decl));
  CHECK_RESULT(ParseUnboundFuncSignature(&field->event.decl.sig));
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}